

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

int64_t gguf_find_tensor(gguf_context *ctx,char *name)

{
  int iVar1;
  long lVar2;
  char *__s2;
  long tensor_id;
  
  lVar2 = ((long)(ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x158;
  tensor_id = 0;
  if (lVar2 < 1) {
    lVar2 = tensor_id;
  }
  while( true ) {
    if (lVar2 == tensor_id) {
      return -1;
    }
    __s2 = gguf_get_tensor_name(ctx,tensor_id);
    iVar1 = strcmp(name,__s2);
    if (iVar1 == 0) break;
    tensor_id = tensor_id + 1;
  }
  return tensor_id;
}

Assistant:

int64_t gguf_find_tensor(const struct gguf_context * ctx, const char * name) {
    // return -1 if tensor not found
    int64_t tensor_id = -1;

    const int64_t n_tensors = gguf_get_n_tensors(ctx);

    for (int64_t i = 0; i < n_tensors; ++i) {
        if (strcmp(name, gguf_get_tensor_name(ctx, i)) == 0) {
            tensor_id = i;
            break;
        }
    }

    return tensor_id;
}